

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound.cpp
# Opt level: O2

char * XPMPSoundAdd(char *sName,char *filePath,bool bLoop,float coneDir,float conePitch,
                   float coneInAngle,float coneOutAngle,float coneOutVol)

{
  long *plVar1;
  bool bVar2;
  char cVar3;
  char *pcVar4;
  allocator<char> local_76;
  allocator<char> local_75;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  string local_60;
  allocator<char> local_40 [32];
  
  local_74 = coneDir;
  local_70 = conePitch;
  local_6c = coneInAngle;
  local_68 = coneOutAngle;
  local_64 = coneOutVol;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,filePath,local_40);
  bVar2 = XPMP2::ExistsFile(&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  plVar1 = XPMP2::gpSndSys;
  if (bVar2) {
    if (XPMP2::gpSndSys == (long *)0x0) {
      pcVar4 = "No sound system available";
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,sName,&local_75);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_40,filePath,&local_76);
      cVar3 = (**(code **)(*plVar1 + 0x10))
                        (local_74,local_70,local_6c,local_68,local_64,plVar1,&local_60,local_40,
                         bLoop);
      std::__cxx11::string::~string((string *)local_40);
      std::__cxx11::string::~string((string *)&local_60);
      pcVar4 = "Failed loading the sound file";
      if (cVar3 != '\0') {
        pcVar4 = "";
      }
    }
  }
  else {
    pcVar4 = "Sound File not found";
    if (XPMP2::glob < 4) {
      XPMP2::LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Sound.cpp"
                    ,0x45a,"XPMPSoundAdd",logERR,"Sound file not found: %s",filePath);
    }
  }
  return pcVar4;
}

Assistant:

const char* XPMPSoundAdd (const char* sName,
                          const char* filePath,
                          bool bLoop,
                          float coneDir, float conePitch,
                          float coneInAngle, float coneOutAngle,
                          float coneOutVol)
{
    // Test file existence first before bothering
    if (!XPMP2::ExistsFile(filePath)) {
        LOG_MSG(XPMP2::logERR, "Sound file not found: %s", filePath)
        return "Sound File not found";
    }
    // No sound system yet available?
    if (!XPMP2::gpSndSys)
        return "No sound system available";
    // Load the sound and add it to the map
    if (!XPMP2::gpSndSys->LoadSoundFile(sName, filePath, bLoop,
                                       coneDir, conePitch, coneInAngle,
                                       coneOutAngle, coneOutVol))
        return "Failed loading the sound file";
    
    // All good
    return "";
}